

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.h
# Opt level: O0

void get_rd_opt_coeff_thresh
               (uint32_t (*coeff_opt_threshold) [2],TxfmSearchParams *txfm_params,
               int enable_winner_mode_for_coeff_opt,int is_winner_mode)

{
  int is_winner_mode_local;
  int enable_winner_mode_for_coeff_opt_local;
  TxfmSearchParams *txfm_params_local;
  uint32_t (*coeff_opt_threshold_local) [2];
  
  if (enable_winner_mode_for_coeff_opt == 0) {
    txfm_params->coeff_opt_thresholds[0] = (*coeff_opt_threshold)[0];
    txfm_params->coeff_opt_thresholds[1] = (*coeff_opt_threshold)[1];
  }
  else if (is_winner_mode == 0) {
    txfm_params->coeff_opt_thresholds[0] = coeff_opt_threshold[1][0];
    txfm_params->coeff_opt_thresholds[1] = coeff_opt_threshold[1][1];
  }
  else {
    txfm_params->coeff_opt_thresholds[0] = coeff_opt_threshold[2][0];
    txfm_params->coeff_opt_thresholds[1] = coeff_opt_threshold[2][1];
  }
  return;
}

Assistant:

static inline void get_rd_opt_coeff_thresh(
    const uint32_t (*const coeff_opt_threshold)[2],
    TxfmSearchParams *txfm_params, int enable_winner_mode_for_coeff_opt,
    int is_winner_mode) {
  if (!enable_winner_mode_for_coeff_opt) {
    // Default initialization of threshold
    txfm_params->coeff_opt_thresholds[0] = coeff_opt_threshold[DEFAULT_EVAL][0];
    txfm_params->coeff_opt_thresholds[1] = coeff_opt_threshold[DEFAULT_EVAL][1];
    return;
  }
  // TODO(any): Experiment with coeff_opt_dist_threshold values when
  // enable_winner_mode_for_coeff_opt is ON
  // TODO(any): Skip the winner mode processing for blocks with lower residual
  // energy as R-D optimization of coefficients would have been enabled during
  // mode decision

  // Use conservative threshold during mode decision and perform R-D
  // optimization of coeffs always for winner modes
  if (is_winner_mode) {
    txfm_params->coeff_opt_thresholds[0] =
        coeff_opt_threshold[WINNER_MODE_EVAL][0];
    txfm_params->coeff_opt_thresholds[1] =
        coeff_opt_threshold[WINNER_MODE_EVAL][1];
  } else {
    txfm_params->coeff_opt_thresholds[0] = coeff_opt_threshold[MODE_EVAL][0];
    txfm_params->coeff_opt_thresholds[1] = coeff_opt_threshold[MODE_EVAL][1];
  }
}